

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

RK_S32 mpi_dec_opt_t(void *ctx,char *next)

{
  int iVar1;
  MPP_RET ret;
  MpiDecTestCmd *cmd;
  char *next_local;
  void *ctx_local;
  
  if (next != (char *)0x0) {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0x200) = iVar1;
    iVar1 = mpp_check_support_format(0,*(undefined4 *)((long)ctx + 0x200));
    if (iVar1 == 0) {
      return 1;
    }
  }
  _mpp_log_l(2,"mpi_dec_utils","invalid input coding type\n",0);
  return 0;
}

Assistant:

RK_S32 mpi_dec_opt_t(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        MPP_RET ret;

        cmd->type = (MppCodingType)atoi(next);
        ret = mpp_check_support_format(MPP_CTX_DEC, cmd->type);
        if (!ret)
            return 1;
    }

    mpp_err("invalid input coding type\n");
    return 0;
}